

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyFromBuffer::prepare
          (BufferCopyFromBuffer *this,PrepareContext *context)

{
  Move<vk::Handle<(vk::HandleType)8>_> *this_00;
  Move<vk::Handle<(vk::HandleType)7>_> *this_01;
  Context *pCVar1;
  InstanceInterface *vki;
  DeviceInterface *vkd;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  VkDeviceSize size;
  VkDevice pVVar2;
  VkAllocationCallbacks *pVVar3;
  deUint32 dVar4;
  void *pvVar5;
  size_t ndx;
  ulong uVar6;
  VkMemoryPropertyFlags properties;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  RefBase<vk::Handle<(vk::HandleType)8>_> local_88;
  Random rng;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  pCVar1 = context->m_context;
  vki = pCVar1->m_vki;
  vkd = pCVar1->m_vkd;
  physicalDevice = pCVar1->m_physicalDevice;
  device = pCVar1->m_device;
  this_02 = &local_48;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_02,&pCVar1->m_queueFamilies
            );
  size = context->m_currentBufferSize;
  this->m_bufferSize = size;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&local_88,vkd,device,size,1,
               VK_SHARING_MODE_EXCLUSIVE,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_02);
  pVVar3 = local_88.m_data.deleter.m_allocator;
  pVVar2 = local_88.m_data.deleter.m_device;
  properties = (VkMemoryPropertyFlags)this_02;
  rng.m_rnd.x = (undefined4)local_88.m_data.object.m_internal;
  rng.m_rnd.y = local_88.m_data.object.m_internal._4_4_;
  rng.m_rnd._8_8_ = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_srcBuffer;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = pVVar2
  ;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       pVVar3;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
       rng.m_rnd._0_8_;
  (this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)rng.m_rnd._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase(&local_88);
  bindBufferMemory((Move<vk::Handle<(vk::HandleType)7>_> *)&local_88,vki,vkd,physicalDevice,device,
                   (VkBuffer)
                   (this_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal
                   ,properties);
  pVVar3 = local_88.m_data.deleter.m_allocator;
  pVVar2 = local_88.m_data.deleter.m_device;
  rng.m_rnd.x = (undefined4)local_88.m_data.object.m_internal;
  rng.m_rnd.y = local_88.m_data.object.m_internal._4_4_;
  rng.m_rnd._8_8_ = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_01 = &this->m_memory;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = pVVar2;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator = pVVar3
  ;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal =
       rng.m_rnd._0_8_;
  (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)rng.m_rnd._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)7>_> *)&local_88);
  pvVar5 = mapMemory(vkd,device,
                     (VkDeviceMemory)
                     (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                     m_internal,this->m_bufferSize);
  deRandom_init(&rng.m_rnd,this->m_seed);
  for (uVar6 = 0; uVar6 < this->m_bufferSize; uVar6 = uVar6 + 1) {
    dVar4 = deRandom_getUint32(&rng.m_rnd);
    *(char *)((long)pvVar5 + uVar6) = (char)dVar4;
  }
  ::vk::flushMappedMemoryRange
            (vkd,device,
             (VkDeviceMemory)
             (this_01->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal,0,
             this->m_bufferSize);
  (*vkd->_vptr_DeviceInterface[8])
            (vkd,device,
             (this_01->super_RefBase<vk::Handle<(vk::HandleType)7>_>).m_data.object.m_internal);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void BufferCopyFromBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize	= context.getBufferSize();
	m_srcBuffer		= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory		= bindBufferMemory(vki, vkd, physicalDevice, device, *m_srcBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);

	{
		void* const	ptr	= mapMemory(vkd, device, *m_memory, m_bufferSize);
		de::Random	rng	(m_seed);

		{
			deUint8* const	data = (deUint8*)ptr;

			for (size_t ndx = 0; ndx < (size_t)m_bufferSize; ndx++)
				data[ndx] = rng.getUint8();
		}

		vk::flushMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);
		vkd.unmapMemory(device, *m_memory);
	}
}